

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
* google::protobuf::Arena::
  CreateArenaCompatible<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,int,int,(google::protobuf::internal::WireFormatLite::FieldType)5,(google::protobuf::internal::WireFormatLite::FieldType)5>>
            (Arena *arena)

{
  MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
  *pMVar1;
  
  if (arena != (Arena *)0x0) {
    pMVar1 = DoCreateMessage<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,int,int,(google::protobuf::internal::WireFormatLite::FieldType)5,(google::protobuf::internal::WireFormatLite::FieldType)5>>
                       (arena);
    return pMVar1;
  }
  pMVar1 = (MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
            *)operator_new(0x30);
  internal::
  MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
  ::MapField(pMVar1,(Arena *)0x0);
  return pMVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  CreateArenaCompatible(Arena* PROTOBUF_NULLABLE arena) {
    static_assert(is_arena_constructable<T>::value,
                  "Can only construct types that are ArenaConstructable");
    if (ABSL_PREDICT_FALSE(arena == nullptr)) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }